

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

QWidget * QApplicationPrivate::focusNextPrevChild_helper
                    (QWidget *toplevel,bool next,bool *wrappingOccurred)

{
  FocusPolicy FVar1;
  bool bVar2;
  byte bVar3;
  FocusPolicy FVar4;
  QWidget *pQVar5;
  QWidget *this;
  QWidget *pQVar6;
  QWidget *pQVar7;
  QWidget *this_00;
  byte bVar8;
  QWidget *local_48;
  
  bVar2 = qt_tab_all_widgets();
  pQVar5 = QWidget::focusWidget(toplevel);
  if (pQVar5 == (QWidget *)0x0) {
    pQVar5 = toplevel;
  }
  this = QWidget::nextInFocusChain(pQVar5);
  FVar1 = ~StrongFocus;
  if (bVar2) {
    FVar1 = ~TabFocus;
  }
  bVar8 = 0;
  bVar3 = 0;
  local_48 = pQVar5;
  for (; (this != (QWidget *)0x0 && (this != pQVar5)); this = QWidget::nextInFocusChain(this)) {
    bVar8 = bVar8 | (byte)(this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                          super_QFlagsStorage<Qt::WindowType>.i;
    pQVar6 = QWidgetPrivate::deepestFocusProxy(*(QWidgetPrivate **)&this->field_0x8);
    pQVar7 = this;
    if (pQVar6 != (QWidget *)0x0) {
      pQVar7 = pQVar6;
    }
    FVar4 = NoFocus;
    if ((pQVar7->data->widget_attributes & 1) == 0) {
      FVar4 = QWidget::focusPolicy(pQVar7);
    }
    if (pQVar6 == (QWidget *)0x0) {
      bVar2 = false;
    }
    else {
      pQVar7 = pQVar6;
      this_00 = this;
      if (next) {
        pQVar7 = this;
        this_00 = pQVar6;
      }
      bVar2 = QWidget::isAncestorOf(this_00,pQVar7);
    }
    if ((((((FVar4 | FVar1) == ~NoFocus) && (bVar2 == false)) &&
         (bVar2 = QWidget::isVisibleTo(this,toplevel), bVar2)) &&
        ((this->data->widget_attributes & 1) == 0)) &&
       (((char)(local_48->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
               super_QFlagsStorage<Qt::WindowType>.i != '\x12' ||
        (bVar2 = QWidget::isAncestorOf(local_48,this), bVar2)))) {
      if ((char)(toplevel->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
                super_QFlagsStorage<Qt::WindowType>.i == '\x12') {
        bVar2 = QWidget::isAncestorOf(toplevel,this);
        if ((pQVar5 != pQVar6) && (bVar2)) {
LAB_002bda00:
          bVar3 = bVar3 | bVar8;
          local_48 = this;
          if (next) break;
        }
      }
      else if (pQVar5 != pQVar6) goto LAB_002bda00;
    }
  }
  if (wrappingOccurred != (bool *)0x0) {
    *wrappingOccurred = (bool)(~(bVar3 ^ next) & 1);
  }
  if (local_48 == pQVar5) {
    if (qt_in_tab_key_event == true) {
      pQVar5 = QWidget::window(local_48);
      QWidget::setAttribute(pQVar5,WA_KeyboardFocusChange,true);
      QWidget::update(local_48);
    }
    local_48 = (QWidget *)0x0;
  }
  return local_48;
}

Assistant:

QWidget *QApplicationPrivate::focusNextPrevChild_helper(QWidget *toplevel, bool next,
                                                        bool *wrappingOccurred)
{
    uint focus_flag = qt_tab_all_widgets() ? Qt::TabFocus : Qt::StrongFocus;

    QWidget *f = toplevel->focusWidget();
    if (!f)
        f = toplevel;

    QWidget *w = f;
    QWidget *test = f->nextInFocusChain();
    bool seenWindow = false;
    bool focusWidgetAfterWindow = false;
    while (test && test != f) {
        if (test->isWindow())
            seenWindow = true;

        // If the next focus widget has a focus proxy, we need to check to ensure
        // that the proxy is in the correct parent-child direction (according to
        // \a next). This is to ensure that we can tab in and out of compound widgets
        // without getting stuck in a tab-loop between parent and child.
        QWidget *focusProxy = test->d_func()->deepestFocusProxy();
        auto effectiveFocusPolicy = [](QWidget *widget) {
            return widget->isEnabled() ? widget->focusPolicy() : Qt::NoFocus;
        };
        const bool canTakeFocus = (effectiveFocusPolicy(focusProxy ? focusProxy : test)
                                  & focus_flag) == focus_flag;
        const bool composites = focusProxy ? (next ? focusProxy->isAncestorOf(test)
                                                   : test->isAncestorOf(focusProxy))
                                           : false;
        if (canTakeFocus && !composites
            && test->isVisibleTo(toplevel) && test->isEnabled()
            && !(w->windowType() == Qt::SubWindow && !w->isAncestorOf(test))
            && (toplevel->windowType() != Qt::SubWindow || toplevel->isAncestorOf(test))
            && f != focusProxy) {
            w = test;
            if (seenWindow)
                focusWidgetAfterWindow = true;
            if (next)
                break;
        }
        test = test->nextInFocusChain();
    }

    if (wrappingOccurred != nullptr)
        *wrappingOccurred = next ? focusWidgetAfterWindow : !focusWidgetAfterWindow;

    if (w == f) {
        if (qt_in_tab_key_event) {
            w->window()->setAttribute(Qt::WA_KeyboardFocusChange);
            w->update();
        }
        return nullptr;
    }
    return w;
}